

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fadop.h
# Opt level: O3

value_type __thiscall
FadBinaryMinus<FadExpr<FadBinaryMinus<FadExpr<FadBinaryAdd<FadCst<double>,_Fad<double>_>_>,_Fad<double>_>_>,_FadExpr<FadBinaryMul<FadCst<double>,_Fad<double>_>_>_>
::dx(FadBinaryMinus<FadExpr<FadBinaryMinus<FadExpr<FadBinaryAdd<FadCst<double>,_Fad<double>_>_>,_Fad<double>_>_>,_FadExpr<FadBinaryMul<FadCst<double>,_Fad<double>_>_>_>
     *this,int i)

{
  Fad<double> *pFVar1;
  double *pdVar2;
  double *pdVar3;
  double *pdVar4;
  
  pFVar1 = (((this->left_->fadexpr_).left_)->fadexpr_).right_;
  pdVar4 = &pFVar1->defaultVal;
  if ((pFVar1->dx_).num_elts != 0) {
    pdVar4 = (pFVar1->dx_).ptr_to_data + i;
  }
  pFVar1 = (this->left_->fadexpr_).right_;
  pdVar3 = &pFVar1->defaultVal;
  if ((pFVar1->dx_).num_elts != 0) {
    pdVar3 = (pFVar1->dx_).ptr_to_data + i;
  }
  pFVar1 = (this->right_->fadexpr_).right_;
  pdVar2 = &pFVar1->defaultVal;
  if ((pFVar1->dx_).num_elts != 0) {
    pdVar2 = (pFVar1->dx_).ptr_to_data + i;
  }
  return (*pdVar4 - *pdVar3) - *pdVar2 * (this->right_->fadexpr_).left_.constant_;
}

Assistant:

const value_type dx(int i) const {return left_.dx(i) - right_.dx(i);}